

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

TString * luaS_createlngstrobj(lua_State *L,size_t l)

{
  uint uVar1;
  TString *pTVar2;
  
  uVar1 = L->l_G->seed;
  pTVar2 = (TString *)luaC_newobj(L,'\x14',l + 0x21);
  pTVar2->hash = uVar1;
  pTVar2->extra = '\0';
  pTVar2->shrlen = -1;
  (pTVar2->u).lnglen = l;
  pTVar2->contents = (char *)&pTVar2->falloc;
  *(undefined1 *)((long)&pTVar2->falloc + l) = 0;
  return pTVar2;
}

Assistant:

TString *luaS_createlngstrobj (lua_State *L, size_t l) {
  size_t totalsize = luaS_sizelngstr(l, LSTRREG);
  TString *ts = createstrobj(L, totalsize, LUA_VLNGSTR, G(L)->seed);
  ts->u.lnglen = l;
  ts->shrlen = LSTRREG;  /* signals that it is a regular long string */
  ts->contents = cast_charp(ts) + offsetof(TString, falloc);
  ts->contents[l] = '\0';  /* ending 0 */
  return ts;
}